

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

completion * __thiscall
mjs::interpreter::impl::operator()
          (completion *__return_storage_ptr__,impl *this,for_in_statement *s)

{
  bool bVar1;
  int iVar2;
  value_type vVar3;
  global_object *pgVar4;
  undefined4 extraout_var;
  expression *peVar5;
  undefined4 extraout_var_00;
  object *poVar6;
  statement *psVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  list *plVar8;
  size_type sVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined1 *ctx;
  EVP_PKEY_CTX *ctx_00;
  completion local_340;
  value local_300;
  reference local_2d8;
  string *n_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<mjs::string,_std::allocator<mjs::string>_> *__range3_1;
  object_ptr o_1;
  undefined1 local_268 [8];
  value ev_1;
  value local_238;
  value local_210;
  undefined1 local_1e8 [8];
  anon_class_16_2_3fe14ecb assign;
  value_type *init;
  variable_statement *var_statement;
  value local_188;
  value local_160;
  string *local_138;
  string *n;
  iterator __end3;
  iterator __begin3;
  vector<mjs::string,_std::allocator<mjs::string>_> *__range3;
  expression *lhs_expression;
  object_ptr o;
  value local_e0;
  undefined1 local_b8 [8];
  value ev;
  completion c;
  anon_class_4_1_ba1d8303 local_3c;
  undefined1 local_38 [4];
  anon_class_4_1_ba1d8303 skip;
  label_set ls;
  for_in_statement *s_local;
  impl *this_local;
  
  get_labels((label_set *)local_38,this,&s->super_statement);
  pgVar4 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
  local_3c.ver = global_object::language_version(pgVar4);
  ctx = value::undefined;
  completion::completion
            ((completion *)
             &ev.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
              super_gc_heap_ptr_untyped.pos_,(value *)value::undefined,normal);
  iVar2 = for_in_statement::init(s,(EVP_PKEY_CTX *)ctx);
  iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))();
  if (iVar2 == 4) {
    peVar5 = for_in_statement::e(s);
    eval(&local_e0,this,peVar5);
    get_value((value *)local_b8,this,&local_e0);
    value::~value(&local_e0);
    vVar3 = value::type((value *)local_b8);
    bVar1 = operator()::anon_class_4_1_ba1d8303::operator()(&local_3c,vVar3);
    if (bVar1) {
      completion::completion(__return_storage_ptr__,(value *)value::undefined,normal);
      o.super_gc_heap_ptr_untyped._12_4_ = 1;
    }
    else {
      pgVar4 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
      (*(pgVar4->super_object)._vptr_object[0x11])(&lhs_expression,pgVar4,local_b8);
      iVar2 = for_in_statement::init(s,(EVP_PKEY_CTX *)pgVar4);
      peVar5 = expression_statement::e((expression_statement *)CONCAT44(extraout_var_00,iVar2));
      poVar6 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)&lhs_expression);
      object::enumerable_property_names
                ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin3,poVar6);
      __end3 = std::vector<mjs::string,_std::allocator<mjs::string>_>::begin
                         ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin3);
      n = (string *)
          std::vector<mjs::string,_std::allocator<mjs::string>_>::end
                    ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin3);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
                                         *)&n), bVar1) {
        local_138 = __gnu_cxx::
                    __normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
                    ::operator*(&__end3);
        eval(&local_160,this,peVar5);
        value::value(&local_188,local_138);
        put_value(this,&local_160,&local_188);
        value::~value(&local_188);
        value::~value(&local_160);
        psVar7 = for_in_statement::s(s);
        eval((completion *)&var_statement,this,psVar7);
        completion::operator=
                  ((completion *)
                   &ev.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                    super_gc_heap_ptr_untyped.pos_,(completion *)&var_statement);
        completion::~completion((completion *)&var_statement);
        bVar1 = handle_completion((completion *)
                                  &ev.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                                   super_gc_heap_ptr_untyped.pos_,(label_set *)local_38);
        if (bVar1) {
          completion::completion
                    (__return_storage_ptr__,
                     (completion *)
                     &ev.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                      super_gc_heap_ptr_untyped.pos_);
          o.super_gc_heap_ptr_untyped._12_4_ = 1;
          goto LAB_00152ae3;
        }
        __gnu_cxx::
        __normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>::
        operator++(&__end3);
      }
      o.super_gc_heap_ptr_untyped._12_4_ = 2;
LAB_00152ae3:
      std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
                ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin3);
      if (o.super_gc_heap_ptr_untyped._12_4_ == 2) {
        o.super_gc_heap_ptr_untyped._12_4_ = 0;
      }
      gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)&lhs_expression);
    }
    value::~value((value *)local_b8);
  }
  else {
    iVar2 = for_in_statement::init(s,(EVP_PKEY_CTX *)ctx);
    iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x18))();
    if (iVar2 != 1) {
      __assert_fail("s.init().type() == statement_type::variable",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,999,"completion mjs::interpreter::impl::operator()(const for_in_statement &)");
    }
    iVar2 = for_in_statement::init(s,(EVP_PKEY_CTX *)ctx);
    plVar8 = variable_statement::l((variable_statement *)CONCAT44(extraout_var_02,iVar2));
    sVar9 = std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::size(plVar8);
    if (sVar9 != 1) {
      __assert_fail("var_statement.l().size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,0x3e9,"completion mjs::interpreter::impl::operator()(const for_in_statement &)"
                   );
    }
    plVar8 = variable_statement::l((variable_statement *)CONCAT44(extraout_var_02,iVar2));
    ctx_00 = (EVP_PKEY_CTX *)0x0;
    assign.this = (impl *)std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::
                          operator[](plVar8,0);
    local_1e8 = (undefined1  [8])this;
    assign.init = (value_type *)assign.this;
    iVar2 = declaration::init((declaration *)assign.this,ctx_00);
    ev_1.field_1.field5[0x1f] = 0;
    if (CONCAT44(extraout_var_03,iVar2) == 0) {
      value::value(&local_210,(value *)value::undefined);
    }
    else {
      iVar2 = declaration::init(assign.init,ctx_00);
      eval(&local_238,this,(expression *)CONCAT44(extraout_var_04,iVar2));
      ev_1.field_1.field5[0x1f] = 1;
      get_value(&local_210,this,&local_238);
    }
    operator()::anon_class_16_2_3fe14ecb::operator()
              ((anon_class_16_2_3fe14ecb *)local_1e8,&local_210);
    value::~value(&local_210);
    if ((ev_1.field_1.field5[0x1f] & 1) != 0) {
      value::~value(&local_238);
    }
    peVar5 = for_in_statement::e(s);
    eval((value *)&o_1.super_gc_heap_ptr_untyped.pos_,this,peVar5);
    get_value((value *)local_268,this,(value *)&o_1.super_gc_heap_ptr_untyped.pos_);
    value::~value((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
    vVar3 = value::type((value *)local_268);
    bVar1 = operator()::anon_class_4_1_ba1d8303::operator()(&local_3c,vVar3);
    if (bVar1) {
      completion::completion(__return_storage_ptr__,(value *)value::undefined,normal);
      o.super_gc_heap_ptr_untyped._12_4_ = 1;
    }
    else {
      pgVar4 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
      (*(pgVar4->super_object)._vptr_object[0x11])(&__range3_1,pgVar4,local_268);
      poVar6 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)&__range3_1);
      object::enumerable_property_names
                ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin3_1,poVar6);
      __end3_1 = std::vector<mjs::string,_std::allocator<mjs::string>_>::begin
                           ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin3_1);
      n_1 = (string *)
            std::vector<mjs::string,_std::allocator<mjs::string>_>::end
                      ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin3_1);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
                                 *)&n_1), bVar1) {
        local_2d8 = __gnu_cxx::
                    __normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
                    ::operator*(&__end3_1);
        value::value(&local_300,local_2d8);
        operator()::anon_class_16_2_3fe14ecb::operator()
                  ((anon_class_16_2_3fe14ecb *)local_1e8,&local_300);
        value::~value(&local_300);
        psVar7 = for_in_statement::s(s);
        eval(&local_340,this,psVar7);
        completion::operator=
                  ((completion *)
                   &ev.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                    super_gc_heap_ptr_untyped.pos_,&local_340);
        completion::~completion(&local_340);
        bVar1 = handle_completion((completion *)
                                  &ev.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                                   super_gc_heap_ptr_untyped.pos_,(label_set *)local_38);
        if (bVar1) {
          completion::completion
                    (__return_storage_ptr__,
                     (completion *)
                     &ev.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                      super_gc_heap_ptr_untyped.pos_);
          o.super_gc_heap_ptr_untyped._12_4_ = 1;
          goto LAB_0015301b;
        }
        __gnu_cxx::
        __normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>::
        operator++(&__end3_1);
      }
      o.super_gc_heap_ptr_untyped._12_4_ = 4;
LAB_0015301b:
      std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
                ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__begin3_1);
      if (o.super_gc_heap_ptr_untyped._12_4_ == 4) {
        o.super_gc_heap_ptr_untyped._12_4_ = 0;
      }
      gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)&__range3_1);
    }
    value::~value((value *)local_268);
  }
  if (o.super_gc_heap_ptr_untyped._12_4_ == 0) {
    completion::completion
              (__return_storage_ptr__,
               (completion *)
               &ev.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                super_gc_heap_ptr_untyped.pos_);
    o.super_gc_heap_ptr_untyped._12_4_ = 1;
  }
  completion::~completion
            ((completion *)
             &ev.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
              super_gc_heap_ptr_untyped.pos_);
  std::
  vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ::~vector((vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const for_in_statement& s) {
        const auto ls = get_labels(s);

        // In ES5.1 for (?? in null/undefined) is just a no-op
        auto skip = [ver = global_->language_version()](value_type t) { return ver >= version::es5 && (t == value_type::undefined || t == value_type::null); };

        completion c{};
        if (s.init().type() == statement_type::expression) {
            auto ev = get_value(eval(s.e()));
            if (skip(ev.type())) {
                return completion{};
            }
            auto o = global_->to_object(ev);
            const auto& lhs_expression = static_cast<const expression_statement&>(s.init()).e();
            for (const auto& n: o->enumerable_property_names()) {
                put_value(eval(lhs_expression), value{n});
                c = eval(s.s());
                if (handle_completion(c, ls)) {
                    return c;
                }
            }
        } else {
            assert(s.init().type() == statement_type::variable);
            const auto& var_statement = static_cast<const variable_statement&>(s.init());
            assert(var_statement.l().size() == 1);
            const auto& init = var_statement.l()[0];

            auto assign = [&](const value& val) {
                put_value(value{active_scope_->lookup(init.id())}, val);
            };

            assign(init.init() ? get_value(eval(*init.init())) : value::undefined);

            // Happens after the initial assignment
            auto ev = get_value(eval(s.e()));
            if (skip(ev.type())) {
                return completion{};
            }
            auto o = global_->to_object(ev);

            for (const auto& n: o->enumerable_property_names()) {
                assign(value{n});
                c = eval(s.s());
                if (handle_completion(c, ls)) {
                    return c;
                }
            }
        }
        return c;
    }